

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O2

void test_font_dimensions(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  ulong uVar2;
  ulong uVar3;
  
  test_string = "XpgyI";
  test_str_len = 5;
  Am_Font::operator=((Am_Font *)&test_font,(Am_Font *)&font_vgi);
  uVar3 = 0;
  uVar2 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x40 != uVar3; uVar3 = uVar3 + 0x40) {
    pAVar1 = *(Am_Drawonable **)((long)&wins_ar->font_win + uVar3);
    update_font_numbers(pAVar1,false);
    (**(code **)(*(long *)pAVar1 + 0x170))
              (pAVar1,&black,test_string,test_str_len,&test_font,0x50,0x104,0,&Am_No_Style,0);
    (**(code **)(*(long *)pAVar1 + 0x160))
              (pAVar1,&black,&Am_No_Style,0x50,0x104,test_string_width,test_string_height,0);
    (**(code **)(*(long *)pAVar1 + 0xa0))(pAVar1);
  }
  test_string = ".,.,.";
  for (uVar3 = 0; uVar2 * 0x40 != uVar3; uVar3 = uVar3 + 0x40) {
    pAVar1 = *(Am_Drawonable **)((long)&wins_ar->font_win + uVar3);
    update_font_numbers(pAVar1,false);
    (**(code **)(*(long *)pAVar1 + 0x170))
              (pAVar1,&black,test_string,test_str_len,&test_font,0x78,0x104,0,&Am_No_Style,0);
    (**(code **)(*(long *)pAVar1 + 0x160))
              (pAVar1,&black,&Am_No_Style,0x78,0x104,test_string_width,test_string_height,0);
    (**(code **)(*(long *)pAVar1 + 0xa0))(pAVar1);
  }
  return;
}

Assistant:

void
test_font_dimensions(wins *wins_ar, int ar_len)
{

  test_string = "XpgyI";
  test_str_len = 5;
  test_font = font_vgi;
  int i;
  for (i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    update_font_numbers(font_win);

    font_win->Draw_Text(black, test_string, test_str_len, test_font, 80, 260);
    font_win->Draw_Rectangle(black, Am_No_Style, 80, 260, test_string_width,
                             test_string_height);
    font_win->Flush_Output();
  }

  test_string = ".,.,.";

  for (i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    update_font_numbers(font_win);

    font_win->Draw_Text(black, test_string, test_str_len, test_font, 120, 260);
    font_win->Draw_Rectangle(black, Am_No_Style, 120, 260, test_string_width,
                             test_string_height);
    font_win->Flush_Output();
  }
}